

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
::ExportConStatus(ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>_>
                  *this,int i_con,Container *cnt,ItemNamer *vnam,bool add2final)

{
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  bool bVar1;
  BasicLogger *pBVar2;
  char *pcVar3;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *this_00;
  BasicCStringRef<char> arg0;
  BasicMemoryWriter<char,_std::allocator<char>_> *pBVar4;
  Container *in_RDX;
  byte in_R8B;
  MemoryWriter pr;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  MemoryWriter wrt;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffff9b8;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *in_stack_fffffffffffff9d0;
  allocator<char> *in_stack_fffffffffffff9d8;
  allocator<char> *alloc;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_> *in_stack_fffffffffffff9e8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_fffffffffffff9f8;
  allocator<char> *paVar5;
  BasicCStringRef<char> local_5e8 [5];
  uint local_5bc;
  uint local_594;
  BasicConstraintKeeper *in_stack_fffffffffffffa70;
  allocator<char> local_511 [585];
  BasicMemoryWriter<char,_std::allocator<char>_> *local_2c8;
  char *local_280;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_278 [2];
  allocator<char> local_251;
  BasicMemoryWriter<char,_std::allocator<char>_> local_250;
  byte local_21;
  Container *local_18;
  
  local_21 = in_R8B & 1;
  local_18 = in_RDX;
  pBVar2 = BasicConstraintKeeper::GetLogger((BasicConstraintKeeper *)in_stack_fffffffffffff9c0);
  if (pBVar2 != (BasicLogger *)0x0) {
    paVar5 = &local_251;
    std::allocator<char>::allocator();
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
              (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    std::allocator<char>::~allocator(&local_251);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
              (local_278,&local_250);
    pcVar3 = BasicConstraintKeeper::GetShortTypeName(in_stack_fffffffffffffa70);
    local_280 = pcVar3;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8);
    key._M_str = (char *)paVar5;
    key._M_len = (size_t)pcVar3;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_fffffffffffff9f8,key);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9c0,(char **)in_stack_fffffffffffff9b8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x37fc45);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8);
    key_00._M_str = (char *)paVar5;
    key_00._M_len = (size_t)pcVar3;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_fffffffffffff9f8,key_00);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9c0,(int *)in_stack_fffffffffffff9b8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x37fca4);
    this_00 = Container::GetCon((Container *)0x37fcb1);
    arg0.data_ = BasicConstraint::name((BasicConstraint *)0x37fcc2);
    if (*(char *)&(((BasicMemoryWriter<char,_std::allocator<char>_> *)arg0.data_)->
                  super_BasicWriter<char>)._vptr_BasicWriter != '\0') {
      in_stack_fffffffffffff9e8 = Container::GetCon((Container *)0x37fce4);
      pBVar4 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
               BasicConstraint::name((BasicConstraint *)0x37fcf5);
      local_2c8 = pBVar4;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9c8);
      key_01._M_str = (char *)paVar5;
      key_01._M_len = (size_t)pcVar3;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
                 key_01);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 in_stack_fffffffffffff9c0,(char **)in_stack_fffffffffffff9b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x37fd68);
      alloc = local_511;
      std::allocator<char>::allocator();
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter(pBVar4,alloc);
      std::allocator<char>::~allocator(local_511);
      in_stack_fffffffffffff9d0 = Container::GetCon((Container *)0x37fda8);
      WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>>
                ((BasicMemoryWriter<char,_std::allocator<char>_> *)arg0.data_,
                 in_stack_fffffffffffff9e8,(ItemNamer *)pBVar4);
      in_stack_fffffffffffff9c8 =
           fmt::BasicWriter<char>::c_str(&in_stack_fffffffffffff9c0->super_BasicWriter<char>);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9c8);
      key_02._M_str = (char *)paVar5;
      key_02._M_len = (size_t)pcVar3;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
                 key_02);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
                 in_stack_fffffffffffff9c0,(char **)in_stack_fffffffffffff9b8);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x37fe4b);
      fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
                (in_stack_fffffffffffff9c0);
    }
    Container::GetDepth(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8);
    key_03._M_str = (char *)paVar5;
    key_03._M_len = (size_t)pcVar3;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
               key_03);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9c0,(int *)in_stack_fffffffffffff9b8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x380009);
    Container::IsUnused(local_18);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8);
    key_04._M_str = (char *)paVar5;
    key_04._M_len = (size_t)pcVar3;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
               key_04);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9c0,(int *)in_stack_fffffffffffff9b8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x38007f);
    bVar1 = Container::IsBridged(local_18);
    local_594 = (uint)bVar1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8);
    key_05._M_str = (char *)paVar5;
    key_05._M_len = (size_t)pcVar3;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
               key_05);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9c0,(int *)in_stack_fffffffffffff9b8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x3800f5);
    local_5bc = local_21 & 1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff9d0,
               in_stack_fffffffffffff9c8);
    key_06._M_str = (char *)paVar5;
    key_06._M_len = (size_t)pcVar3;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)this_00,
               key_06);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               in_stack_fffffffffffff9c0,(int *)in_stack_fffffffffffff9b8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x380154);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x380161);
    fmt::BasicCStringRef<char>::BasicCStringRef(local_5e8,"\n");
    fmt::BasicWriter<char>::write<>((BasicWriter<char> *)in_stack_fffffffffffff9e8,arg0);
    pBVar4 = (BasicMemoryWriter<char,_std::allocator<char>_> *)
             BasicConstraintKeeper::GetLogger((BasicConstraintKeeper *)in_stack_fffffffffffff9c0);
    BasicLogger::Append<fmt::BasicMemoryWriter<char,std::allocator<char>>>
              ((BasicLogger *)pBVar4,in_stack_fffffffffffff9b8);
    fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(pBVar4);
  }
  return;
}

Assistant:

void ExportConStatus(int i_con, const Container& cnt,
                       ItemNamer& vnam, bool add2final) {
    if (GetLogger()) {
      fmt::MemoryWriter wrt;
      {
        MiniJSONWriter jw(wrt);
        jw["CON_TYPE"] = GetShortTypeName();
        jw["index"] = i_con;
        if (*cnt.GetCon().name()) {
          jw["name"] = cnt.GetCon().name();
          {
            fmt::MemoryWriter pr;
            WriteFlatCon(pr, cnt.GetCon(), vnam);
            jw["printed"] = pr.c_str();
          }
        }
        jw["depth"] = cnt.GetDepth();
        jw["unused"] = (int)cnt.IsUnused();
        jw["bridged"] = (int)cnt.IsBridged();
        jw["final"] = (int)add2final;
      }
      wrt.write("\n");                     // EOL
      GetLogger()->Append(wrt);
    }
  }